

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brightness_ctrl.cpp
# Opt level: O2

void __thiscall BrightnessControl::_brightness_slide(BrightnessControl *this,int p)

{
  uint uVar1;
  int iVar2;
  uint v;
  int iVar3;
  double dVar4;
  double dVar5;
  duration<long,_std::ratio<1L,_1000L>_> local_50;
  double local_48;
  undefined8 uStack_40;
  
  std::mutex::lock(&this->adjust_m);
  iVar2 = p + this->offset;
  if (99 < iVar2) {
    iVar2 = 100;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  uVar1 = (iVar2 * this->maxbr) / 100;
  v = this->minabr;
  if (this->minabr < (int)uVar1) {
    v = uVar1;
  }
  fprintf(_stderr,"%c: brightness adjust: %d->%d/%d\n",0x49,(ulong)(uint)this->br,(ulong)v);
  iVar2 = this->br;
  local_48 = 1.0;
  uStack_40 = 0;
  do {
    iVar3 = this->br;
    dVar5 = (double)iVar3;
    if ((int)v < iVar2) {
      dVar4 = round(-local_48);
      if (dVar4 + dVar5 < (double)(int)v) goto LAB_0010c926;
    }
    else {
      dVar4 = round(local_48);
      if ((double)(int)v < dVar4 + dVar5) {
LAB_0010c926:
        this->br = v;
        writeint((this->brpath)._M_pathname._M_dataplus._M_p,v);
        pthread_mutex_unlock((pthread_mutex_t *)&this->adjust_m);
        return;
      }
    }
    dVar5 = round(local_48 * (double)(int)((uint)(iVar2 <= (int)v) * 2 + -1));
    iVar3 = iVar3 + (int)dVar5;
    this->br = iVar3;
    writeint((this->brpath)._M_pathname._M_dataplus._M_p,iVar3);
    local_50.__r = 10;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_50);
    local_48 = local_48 * 1.2;
  } while( true );
}

Assistant:

void BrightnessControl::_brightness_slide(int p)
{
	std::lock_guard<std::mutex> adjust_lck(adjust_m);
	p+=offset;
	if(p>100)p=100;
	if(p<0)p=0;
	int pbr=maxbr*p/100;
	if(pbr<minabr)pbr=minabr;
	LOG('I',"brightness adjust: %d->%d/%d",br,pbr,maxbr);
	int d=1;if(pbr<br)d=-1;double dd=1;
	while(d>0&&br+round(d*dd)<=pbr||d<0&&br+round(d*dd)>=pbr)
	{
		br+=(int)round(d*dd);writeint(brpath.c_str(),br);
		dd=dd*1.2;std::this_thread::sleep_for(std::chrono::milliseconds(10));
	}
	br=pbr;writeint(brpath.c_str(),br);
}